

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadFunctions.cpp
# Opt level: O2

void __thiscall
Consumer::operator()
          (Consumer *this,Queue<int> *q,int id,
          vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
          *subscribeTime,
          vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
          *unsubscribeTime,TimeT readingCycleTime)

{
  int *piVar1;
  long lVar2;
  const_reference pvVar3;
  optional<int> oVar4;
  long lVar5;
  const_reference pvVar6;
  ostream *poVar7;
  id __id;
  basic_ostream<char,_std::char_traits<char>_> *pbVar8;
  ulong __n;
  ulong __n_00;
  _Storage<int,_true> _Var9;
  int *it;
  int *piVar10;
  unique_lock<std::mutex> mlock;
  unique_lock<std::mutex> local_60;
  int local_4c;
  Consumer *local_48;
  ulong local_40;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  
  local_4c = id;
  local_38.__r = readingCycleTime.__r;
  lVar2 = std::chrono::_V2::system_clock::now();
  local_48 = this;
  std::vector<int,_std::allocator<int>_>::reserve(&this->consumedValues,200);
  __n_00 = 0;
  pvVar3 = std::
           vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
           ::at(subscribeTime,0);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(pvVar3);
  do {
    rtb::Concurrency::Queue<int>::subscribe(q);
    __n = __n_00 & 0xffffffff;
    do {
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_38);
      oVar4 = rtb::Concurrency::Queue<int>::pop(q);
      if (((ulong)oVar4.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int> >> 0x20 & 1) == 0) {
        std::__throw_bad_optional_access();
      }
      _Var9._M_value =
           oVar4.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
           _M_payload;
      local_60._M_device = (mutex_type *)CONCAT44(local_60._M_device._4_4_,_Var9._M_value);
      if (_Var9._M_value != 0x7fffffff) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (&local_48->consumedValues,(value_type_conflict *)&local_60);
      }
      pvVar3 = std::
               vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
               ::at(unsubscribeTime,__n);
      lVar5 = std::chrono::_V2::system_clock::now();
    } while ((_Var9._M_value != 0x7fffffff) && ((lVar5 - lVar2) / 1000000 < pvVar3->__r));
    rtb::Concurrency::Queue<int>::unsubscribe(q);
    __n_00 = (ulong)((int)__n_00 + 1);
    if (__n_00 < (ulong)((long)(subscribeTime->
                               super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(subscribeTime->
                               super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 3)) {
      pvVar3 = std::
               vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
               ::at(subscribeTime,__n_00);
      local_40 = __n_00;
      pvVar6 = std::
               vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
               ::at(unsubscribeTime,__n);
      __n_00 = local_40;
      local_60._M_device = (mutex_type *)(pvVar3->__r - pvVar6->__r);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)&local_60);
    }
  } while ((_Var9._M_value != 0x7fffffff) &&
          (__n_00 < (ulong)((long)(subscribeTime->
                                  super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(subscribeTime->
                                  super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 3)));
  std::unique_lock<std::mutex>::unique_lock(&local_60,&outputMutex);
  poVar7 = std::operator<<((ostream *)&std::cout,"Consumer ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_4c);
  poVar7 = std::operator<<(poVar7," (");
  __id._M_thread = pthread_self();
  pbVar8 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar7,__id);
  std::operator<<((ostream *)pbVar8,")  popped the following values: \n");
  piVar1 = (local_48->consumedValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar10 = (local_48->consumedValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start; piVar10 != piVar1; piVar10 = piVar10 + 1) {
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar10);
    std::operator<<(poVar7," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::unique_lock<std::mutex>::unlock(&local_60);
  std::unique_lock<std::mutex>::~unique_lock(&local_60);
  return;
}

Assistant:

void Consumer::operator()(Queue<int> &q,
    const int id,
    const std::vector<TimeT> &subscribeTime,
    const std::vector<TimeT> &unsubscribeTime,
    TimeT readingCycleTime) {
    bool lastMessage = false;
    unsigned nextConsumerPeriod = 0;

    auto start = std::chrono::system_clock::now();
    consumedValues.reserve(200);
    std::this_thread::sleep_for(subscribeTime.at(nextConsumerPeriod));

    // start time for consumers and producer are not exactly the same
    // but for test purposes is ok

    do {
        q.subscribe();

        bool timeToUnsubscribe = false;

        do {
            std::this_thread::sleep_for(readingCycleTime);
            auto item = q.pop().value();
            lastMessage = (item == std::numeric_limits<int>::max());
            if (!lastMessage) consumedValues.push_back(item);

            timeToUnsubscribe =
                (unsubscribeTime.at(nextConsumerPeriod)
                    <= std::chrono::duration_cast<TimeT>(std::chrono::system_clock::now() - start));

        } while (!lastMessage && !timeToUnsubscribe);
        q.unsubscribe();
        nextConsumerPeriod++;
        if (nextConsumerPeriod < subscribeTime.size()) {
            std::this_thread::sleep_for(
                subscribeTime.at(nextConsumerPeriod) - unsubscribeTime.at(nextConsumerPeriod - 1));
        }
    } while ((!lastMessage) && (nextConsumerPeriod < subscribeTime.size()));

    std::unique_lock<std::mutex> mlock(outputMutex);
    std::cout << "Consumer " << id << " (" << std::this_thread::get_id()
              << ")  popped the following values: \n";
    for (auto &it : consumedValues)
        std::cout << it << " ";
    std::cout << std::endl;
    mlock.unlock();
}